

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmem.cpp
# Opt level: O1

Error __thiscall asmjit::VMemMgr::shrink(VMemMgr *this,void *p,size_t used)

{
  uint8_t *puVar1;
  Error EVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  size_t *psVar6;
  size_t *psVar7;
  MemNode *pMVar8;
  size_t sVar9;
  ulong uVar10;
  size_t sVar11;
  bool bVar12;
  
  if (p == (void *)0x0) {
    return 0;
  }
  if (used == 0) {
    EVar2 = release(this,p);
    return EVar2;
  }
  pthread_mutex_lock((pthread_mutex_t *)this);
  pMVar8 = this->_root;
  do {
    if (pMVar8 == (MemNode *)0x0) {
      pMVar8 = (MemNode *)0x0;
      break;
    }
    puVar1 = (pMVar8->super_RbNode).mem;
    if (p < puVar1) {
LAB_001747ee:
      pMVar8 = (MemNode *)(pMVar8->super_RbNode).node[0];
      bVar12 = true;
    }
    else {
      if (puVar1 + pMVar8->size <= p) {
        pMVar8 = (MemNode *)((pMVar8->super_RbNode).node + 1);
        goto LAB_001747ee;
      }
      bVar12 = false;
    }
  } while (bVar12);
  if (pMVar8 == (MemNode *)0x0) {
    EVar2 = 3;
  }
  else {
    uVar4 = pMVar8->density;
    uVar3 = (ulong)((long)p - (long)(pMVar8->super_RbNode).mem) / uVar4;
    uVar10 = uVar3 >> 6;
    sVar9 = pMVar8->baCont[uVar10];
    uVar4 = ((used - 1) + uVar4) / uVar4;
    EVar2 = 0;
    if ((sVar9 >> (uVar3 & 0x3f) & 1) != 0) {
      psVar7 = pMVar8->baCont + uVar10;
      uVar3 = 1L << (uVar3 & 0x3f);
      psVar6 = pMVar8->baUsed + uVar10;
      sVar11 = *psVar6;
      do {
        uVar4 = uVar4 - 1;
        if (uVar4 == 0) {
          lVar5 = 0;
          bVar12 = false;
          goto LAB_001748a5;
        }
        uVar3 = uVar3 * 2;
        if (uVar3 == 0) {
          sVar11 = psVar6[1];
          psVar6 = psVar6 + 1;
          sVar9 = psVar7[1];
          psVar7 = psVar7 + 1;
          uVar3 = 1;
        }
        EVar2 = 0;
      } while ((uVar3 & sVar9) != 0);
    }
  }
LAB_00174907:
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return EVar2;
LAB_001748a5:
  sVar9 = ~uVar3 & sVar9;
  uVar3 = uVar3 * 2;
  if (uVar3 == 0 || bVar12) {
    *psVar6 = sVar11;
    *psVar7 = sVar9;
    if (bVar12) goto LAB_001748ed;
    sVar11 = psVar6[1];
    psVar6 = psVar6 + 1;
    sVar9 = psVar7[1];
    psVar7 = psVar7 + 1;
    uVar3 = 1;
  }
  bVar12 = (uVar3 & sVar9) == 0;
  sVar11 = ~uVar3 & sVar11;
  lVar5 = lVar5 + 1;
  goto LAB_001748a5;
LAB_001748ed:
  uVar4 = lVar5 * pMVar8->density;
  if (pMVar8->largestBlock < uVar4) {
    pMVar8->largestBlock = uVar4;
  }
  pMVar8->used = pMVar8->used - uVar4;
  this->_usedBytes = this->_usedBytes - uVar4;
  EVar2 = 0;
  goto LAB_00174907;
}

Assistant:

Error VMemMgr::shrink(void* p, size_t used) noexcept {
  if (!p) return kErrorOk;
  if (used == 0)
    return release(p);

  AutoLock locked(_lock);
  MemNode* node = vMemMgrFindNodeByPtr(this, (uint8_t*)p);
  if (!node) return DebugUtils::errored(kErrorInvalidArgument);

  size_t offset = (size_t)((uint8_t*)p - (uint8_t*)node->mem);
  size_t bitpos = M_DIV(offset, node->density);
  size_t i = (bitpos / kBitsPerEntity);

  size_t* up = node->baUsed + i;  // Current ubits address.
  size_t* cp = node->baCont + i;  // Current cbits address.
  size_t ubits = *up;             // Current ubits[0] value.
  size_t cbits = *cp;             // Current cbits[0] value.
  size_t bit = (size_t)1 << (bitpos % kBitsPerEntity);

  size_t cont = 0;
  size_t usedBlocks = (used + node->density - 1) / node->density;

  bool stop;

  // Find the first block we can mark as free.
  for (;;) {
    stop = (cbits & bit) == 0;
    if (stop)
      return kErrorOk;

    if (++cont == usedBlocks)
      break;

    bit <<= 1;
    if (bit == 0) {
      ubits = *++up;
      cbits = *++cp;
      bit = 1;
    }
  }

  // Free the tail blocks.
  cont = ~(size_t)0;
  goto _EnterFreeLoop;

  for (;;) {
    stop = (cbits & bit) == 0;
    ubits &= ~bit;

_EnterFreeLoop:
    cbits &= ~bit;

    bit <<= 1;
    cont++;

    if (stop || bit == 0) {
      *up = ubits;
      *cp = cbits;
      if (stop)
        break;

      ubits = *++up;
      cbits = *++cp;
      bit = 1;
    }
  }

  // Statistics.
  cont *= node->density;
  if (node->largestBlock < cont)
    node->largestBlock = cont;

  node->used -= cont;
  _usedBytes -= cont;

  return kErrorOk;
}